

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

int __thiscall SliceUnit::deserializeSliceType(SliceUnit *this,uint8_t *buffer,uint8_t *end)

{
  int iVar1;
  uint uVar2;
  BitStreamException *e;
  uint sliceType;
  int local_30;
  int offset;
  int rez;
  uint8_t *end_local;
  uint8_t *buffer_local;
  SliceUnit *this_local;
  
  if ((long)end - (long)buffer < 2) {
    this_local._4_4_ = -10;
  }
  else {
    this_local._4_4_ = NALUnit::deserialize(&this->super_NALUnit,buffer,end);
    if (this_local._4_4_ == 0) {
      local_30 = 1;
      if ((this->super_NALUnit).nal_unit_type == nuSliceExt) {
        if ((long)end - (long)buffer < 5) {
          return -10;
        }
        local_30 = 4;
        iVar1 = 4;
        if (((buffer[1] == '\0') && (iVar1 = local_30, buffer[2] == '\0')) && (buffer[3] == '\x03'))
        {
          iVar1 = 5;
        }
        local_30 = iVar1;
        this->non_idr_flag = buffer[1] & 0x40;
        this->anchor_pic_flag = buffer[local_30 + -1] & 4;
      }
      BitStreamReader::setBuffer(&(this->super_NALUnit).bitReader,buffer + local_30,end);
      uVar2 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
      this->first_mb_in_slice = uVar2;
      uVar2 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
      if (uVar2 < 10) {
        this->slice_type = uVar2;
        this->orig_slice_type = uVar2;
        if (4 < this->slice_type) {
          this->slice_type = this->slice_type - 5;
        }
        this_local._4_4_ = 0;
      }
      else {
        this_local._4_4_ = 1;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int SliceUnit::deserializeSliceType(uint8_t* buffer, uint8_t* end)
{
    if (end - buffer < 2)
        return NOT_ENOUGH_BUFFER;

    const int rez = NALUnit::deserialize(buffer, end);
    if (rez != 0)
        return rez;

    try
    {
        int offset = 1;
        if (nal_unit_type == NALType::nuSliceExt)
        {
            if (end - buffer < 5)
                return NOT_ENOUGH_BUFFER;
            offset += 3;
            if (buffer[1] == 0 && buffer[2] == 0 && buffer[3] == 3)
                offset++;  // inplace decode header
            non_idr_flag = buffer[1] & 0x40;
            anchor_pic_flag = buffer[offset - 1] & 0x04;
        }

        bitReader.setBuffer(buffer + offset, end);
        first_mb_in_slice = extractUEGolombCode();
        const unsigned sliceType = extractUEGolombCode();
        if (sliceType > 9)
            return 1;
        orig_slice_type = slice_type = sliceType;
        if (slice_type > 4)
            slice_type -= 5;  // +5 flag is: all other slice at this picture must be same type

        return 0;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}